

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteTopLevelProject
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmLocalGenerator *root)

{
  bool bVar1;
  cmMakefile *pcVar2;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_c9;
  string local_c8;
  cmValue local_a8;
  cmValue osDirOption;
  allocator<char> local_91;
  string local_90;
  cmValue local_70;
  cmValue osDir;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue bspName;
  cmLocalGenerator *root_local;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  bspName.Value = (string *)root;
  WriteFileHeader(this,fout);
  WriteMacros(this,fout,(cmLocalGenerator *)bspName.Value);
  WriteHighLevelDirectives(this,fout,(cmLocalGenerator *)bspName.Value);
  GhsMultiGpj::WriteGpjTag(PROJECT,fout);
  std::operator<<(fout,"# Top Level Project File\n");
  pcVar2 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)bspName.Value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GHS_BSP_NAME",&local_49);
  local_28 = cmMakefile::GetDefinition(pcVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  osDir.Value = local_28.Value;
  bVar1 = cmIsOff(local_28);
  if (!bVar1) {
    poVar3 = std::operator<<(fout,"    -bsp ");
    psVar4 = cmValue::operator*[abi_cxx11_(&local_28);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,'\n');
  }
  pcVar2 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)bspName.Value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"GHS_OS_DIR",&local_91);
  local_70 = cmMakefile::GetDefinition(pcVar2,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  osDirOption.Value = local_70.Value;
  bVar1 = cmIsOff(local_70);
  if (!bVar1) {
    pcVar2 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)bspName.Value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"GHS_OS_DIR_OPTION",&local_c9);
    local_a8 = cmMakefile::GetDefinition(pcVar2,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::operator<<(fout,"    ");
    bVar1 = cmIsOff(local_a8);
    if (bVar1) {
      std::operator<<(fout,"");
    }
    else {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_a8);
      std::operator<<(fout,(string *)psVar4);
    }
    poVar3 = std::operator<<(fout,"\"");
    poVar3 = ::operator<<(poVar3,local_70);
    std::operator<<(poVar3,"\"\n");
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTopLevelProject(std::ostream& fout,
                                                     cmLocalGenerator* root)
{
  this->WriteFileHeader(fout);
  this->WriteMacros(fout, root);
  this->WriteHighLevelDirectives(fout, root);
  GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fout);

  fout << "# Top Level Project File\n";

  // Specify BSP option if supplied by user
  // -- not all platforms require this entry in the project file
  cmValue bspName = root->GetMakefile()->GetDefinition("GHS_BSP_NAME");
  if (!cmIsOff(bspName)) {
    fout << "    -bsp " << *bspName << '\n';
  }

  // Specify OS DIR if supplied by user
  // -- not all platforms require this entry in the project file
  cmValue osDir = root->GetMakefile()->GetDefinition("GHS_OS_DIR");
  if (!cmIsOff(osDir)) {
    cmValue osDirOption =
      root->GetMakefile()->GetDefinition("GHS_OS_DIR_OPTION");
    fout << "    ";
    if (cmIsOff(osDirOption)) {
      fout << "";
    } else {
      fout << *osDirOption;
    }
    fout << "\"" << osDir << "\"\n";
  }
}